

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O3

boolean check_room(level *lev,xchar *lowx,xchar *ddx,xchar *lowy,xchar *ddy,boolean vault)

{
  char cVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  boolean bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  schar *psVar10;
  int iVar11;
  uint uVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  
  uVar9 = (uint)*lowx;
  cVar1 = *ddx;
  cVar2 = *lowy;
  cVar3 = *ddy;
  uVar12 = (int)cVar2;
  uVar7 = uVar9;
  if ((int)uVar9 < 3) {
    *lowx = '\x03';
    uVar12 = (uint)(byte)*lowy;
    uVar7 = 3;
  }
  if ((char)uVar12 < '\x02') {
    *lowy = '\x02';
    uVar7 = (uint)(byte)*lowx;
    uVar12 = 2;
  }
  iVar16 = 0x4d;
  if ((int)((int)cVar1 + uVar9) < 0x4d) {
    iVar16 = (int)cVar1 + uVar9;
  }
  iVar14 = (int)(char)uVar7;
  bVar5 = '\0';
  if (iVar14 < iVar16) {
    iVar11 = (int)cVar3 + (int)cVar2;
    iVar6 = 4 - (uint)(vault == '\0');
    uVar9 = vault == '\0' ^ 5;
    iVar8 = 0x12;
    if (iVar11 < 0x12) {
      iVar8 = iVar11;
    }
LAB_0024ae84:
    if ((char)uVar12 < iVar8) {
      uVar15 = iVar14 - uVar9;
      if ((int)uVar15 <= (int)(uVar9 + iVar16)) {
        uVar12 = (char)uVar12 - iVar6;
        if ((int)uVar12 < 1) {
          uVar12 = 0;
        }
        iVar14 = iVar8 + iVar6;
        if (0x13 < iVar8 + iVar6) {
          iVar14 = 0x14;
        }
        do {
          if ((0xffffffb0 < uVar15 - 0x50) && ((int)uVar12 <= iVar14)) {
            psVar10 = &lev->locations[uVar15][uVar12].typ;
            iVar11 = uVar12 - 1;
            bVar4 = (char)iVar6 + (char)uVar12;
            do {
              bVar4 = bVar4 + 1;
              if (*psVar10 != '\0') {
                uVar12 = mt_random();
                if (uVar12 * -0x55555555 < 0x55555556) goto LAB_0024af92;
                uVar7 = (uint)*lowx;
                if ((int)uVar15 < (int)uVar7) {
                  bVar13 = (char)uVar15 + (char)uVar9 + 1;
                  uVar7 = (uint)bVar13;
                  *lowx = bVar13;
                }
                else {
                  iVar16 = uVar15 + ~uVar9;
                }
                uVar12 = (uint)*lowy;
                if (iVar11 + 1 < (int)uVar12) {
                  *lowy = bVar4;
                  uVar7 = (uint)(byte)*lowx;
                  uVar12 = (uint)bVar4;
                }
                else {
                  iVar8 = iVar11 - iVar6;
                }
                iVar14 = (int)(char)uVar7;
                if (iVar14 < iVar16) goto LAB_0024ae84;
                goto LAB_0024af92;
              }
              psVar10 = psVar10 + 0xc;
              iVar11 = iVar11 + 1;
            } while (iVar11 < iVar14);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar9 + 1 + iVar16);
      }
      *ddx = (char)iVar16 - (char)uVar7;
      *ddy = (char)iVar8 - *lowy;
      bVar5 = '\x01';
    }
    else {
LAB_0024af92:
      bVar5 = '\0';
    }
  }
  return bVar5;
}

Assistant:

boolean check_room(struct level *lev, xchar *lowx, xchar *ddx,
		   xchar *lowy, xchar *ddy, boolean vault)
{
	int x, y, hix = *lowx + *ddx, hiy = *lowy + *ddy;
	struct rm *loc;
	int xlim, ylim, ymax;

	xlim = XLIM + (vault ? 1 : 0);
	ylim = YLIM + (vault ? 1 : 0);

	if (*lowx < 3)		*lowx = 3;
	if (*lowy < 2)		*lowy = 2;
	if (hix > COLNO-3)	hix = COLNO - 3;
	if (hiy > ROWNO-3)	hiy = ROWNO - 3;
chk:
	if (hix <= *lowx || hiy <= *lowy)	return FALSE;

	/* check area around room (and make room smaller if necessary) */
	for (x = *lowx - xlim; x <= hix + xlim; x++) {
		if (x <= 0 || x >= COLNO) continue;
		y = *lowy - ylim;
		ymax = hiy + ylim;
		if (y < 0)
		    y = 0;
		if (ymax >= ROWNO)
		    ymax = ROWNO - 1;
		loc = &lev->locations[x][y];
		
		for (; y <= ymax; y++) {
			if (loc++->typ) {
				if (!rn2(3))
				    return FALSE;

				if (x < *lowx)
				    *lowx = x + xlim + 1;
				else
				    hix = x - xlim - 1;
				if (y < *lowy)
				    *lowy = y + ylim + 1;
				else
				    hiy = y - ylim - 1;
				goto chk;
			}
		}
	}
	*ddx = hix - *lowx;
	*ddy = hiy - *lowy;
	return TRUE;
}